

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::tryReadWithFds
          (AbortedRead *this,void *readBuffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds)

{
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[28]>
            ((String *)&local_1c0,(Debug *)"\"abortRead() has been called\"",
             "abortRead() has been called",(char (*) [28])maxBytes);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x58c,(String *)&local_1c0);
  Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<ReadResult> tryReadWithFds(void* readBuffer, size_t minBytes, size_t maxBytes,
                                       OwnFd* fdBuffer, size_t maxFds) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }